

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

stream * opentempfile(char *name,char *mode)

{
  stream *psVar1;
  FILE *pFVar2;
  
  findfile(name,mode);
  psVar1 = (stream *)operator_new(0x10);
  psVar1->_vptr_stream = (_func_int **)&PTR__filestream_00182b38;
  psVar1[1]._vptr_stream = (_func_int **)0x0;
  pFVar2 = tmpfile64();
  psVar1[1]._vptr_stream = (_func_int **)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    (*psVar1->_vptr_stream[1])(psVar1);
    psVar1 = (stream *)0x0;
  }
  return psVar1;
}

Assistant:

stream *opentempfile(const char *name, const char *mode)
{
    const char *found = findfile(name, mode);
    filestream *file = new filestream;
    if(!file->opentemp(found ? found : name, mode)) { delete file; return NULL; }
    return file;
}